

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O0

FFlagDef * FindFlag(PClass *type,char *part1,char *part2,bool strict)

{
  bool bVar1;
  int iVar2;
  PClass *pPVar3;
  char *__s1;
  ulong local_48;
  size_t i_1;
  int i;
  int max;
  FFlagDef *def;
  bool strict_local;
  char *part2_local;
  char *part1_local;
  PClass *type_local;
  
  if (part2 == (char *)0x0) {
    iVar2 = 7;
    if (strict) {
      iVar2 = 2;
    }
    for (i_1._0_4_ = 0; (int)i_1 < iVar2; i_1._0_4_ = (int)i_1 + 1) {
      if ((((FlagLists[(int)i_1].Use & 1U) != 0) &&
          (bVar1 = PClass::IsDescendantOf(type,*FlagLists[(int)i_1].Type), bVar1)) &&
         (pPVar3 = (PClass *)FindFlag(FlagLists[(int)i_1].Defs,FlagLists[(int)i_1].NumDefs,part1),
         pPVar3 != (PClass *)0x0)) {
        return (FFlagDef *)pPVar3;
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
      __s1 = FName::GetChars(&((*FlagLists[local_48].Type)->super_PNativeStruct).super_PStruct.
                              super_PNamedType.TypeName);
      iVar2 = strcasecmp(__s1,part1);
      if (iVar2 == 0) {
        bVar1 = PClass::IsDescendantOf(type,*FlagLists[local_48].Type);
        if (!bVar1) {
          return (FFlagDef *)(PClass *)0x0;
        }
        pPVar3 = (PClass *)FindFlag(FlagLists[local_48].Defs,FlagLists[local_48].NumDefs,part2);
        return (FFlagDef *)pPVar3;
      }
    }
  }
  return (FFlagDef *)(PClass *)0x0;
}

Assistant:

FFlagDef *FindFlag (const PClass *type, const char *part1, const char *part2, bool strict)
{
	FFlagDef *def;

	if (part2 == NULL)
	{ // Search all lists
		int max = strict ? 2 : NUM_FLAG_LISTS;
		for (int i = 0; i < max; ++i)
		{
			if ((FlagLists[i].Use & 1) && type->IsDescendantOf (*FlagLists[i].Type))
			{
				def = FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part1);
				if (def != NULL)
				{
					return def;
				}
			}
		}
	}
	else
	{ // Search just the named list
		for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
		{
			if (stricmp ((*FlagLists[i].Type)->TypeName.GetChars(), part1) == 0)
			{
				if (type->IsDescendantOf (*FlagLists[i].Type))
				{
					return FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part2);
				}
				else
				{
					return NULL;
				}
			}
		}
	}
	return NULL;
}